

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

uint64_t my_ntohll(uint64_t *original)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t *original_local;
  
  uVar1 = my_ntohl((uint32_t)*original);
  uVar2 = my_ntohl((uint32_t)(*original >> 0x20));
  return CONCAT44(uVar1,uVar2);
}

Assistant:

uint64_t my_ntohll(const uint64_t& original)
{
#ifdef SPARC_V9  // big endian
    return original;
#else  // little endian
    return (static_cast<uint64_t>(my_ntohl(static_cast<uint32_t>(original))) << 32) |
           static_cast<uint64_t>(my_ntohl(static_cast<uint32_t>(original >> 32)));
#endif
}